

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

shared_ptr<mocker::ir::Reg> __thiscall
mocker::ir::Builder::makeReg(Builder *this,string *identifier)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__args;
  string *hint;
  char *pcVar1;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<mocker::ir::Reg> sVar3;
  undefined1 local_118 [24];
  string local_100 [32];
  undefined1 local_e0 [8];
  shared_ptr<mocker::ir::Reg> instancePtr;
  shared_ptr<mocker::ir::Reg> instancePtrPtr;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  string local_60 [8];
  string varName;
  string className;
  string *identifier_local;
  Builder *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  pcVar1 = (char *)std::__cxx11::string::at((ulong)in_RDX);
  if (*pcVar1 == '@') {
    sVar3 = std::make_shared<mocker::ir::Reg,std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    _Var2 = sVar3.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    pcVar1 = (char *)std::__cxx11::string::at((ulong)in_RDX);
    if (*pcVar1 == '#') {
      std::__cxx11::string::string((string *)(varName.field_2._M_local_buf + 8));
      std::__cxx11::string::string(local_60);
      splitMemberVarIdent(&local_a0,(Builder *)identifier,in_RDX);
      __args = &instancePtrPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      std::tie<std::__cxx11::string,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&varName.field_2 + 8));
      std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
                ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)__args,&local_a0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_a0);
      std::make_shared<mocker::ir::Reg,char_const(&)[5]>
                ((char (*) [5])
                 &instancePtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      hint = (string *)identifier->_M_string_length;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_100,"instPtr",(allocator<char> *)(local_118 + 0x17));
      BuilderContext::makeTempLocalReg((BuilderContext *)local_e0,hint);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)(local_118 + 0x17));
      BuilderContext::
      emplaceInst<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                ((BuilderContext *)identifier->_M_string_length,
                 (shared_ptr<mocker::ir::Reg> *)local_e0,
                 (shared_ptr<mocker::ir::Reg> *)
                 &instancePtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                ((shared_ptr<mocker::ir::Addr> *)local_118,(shared_ptr<mocker::ir::Reg> *)local_e0);
      getMemberElementPtr(this,(shared_ptr<mocker::ir::Addr> *)identifier,(string *)local_118,
                          (string *)((long)&varName.field_2 + 8));
      std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)local_118);
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_e0);
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr
                ((shared_ptr<mocker::ir::Reg> *)
                 &instancePtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string((string *)(varName.field_2._M_local_buf + 8));
      _Var2._M_pi = extraout_RDX;
    }
    else {
      sVar3 = std::make_shared<mocker::ir::Reg,std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      _Var2 = sVar3.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    }
  }
  sVar3.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Reg>)
         sVar3.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reg> Builder::makeReg(std::string identifier) const {
  if (identifier.at(0) == '@') // is global variable
    return std::make_shared<Reg>(std::move(identifier));
  if (identifier.at(0) == '#') { // is member variable
    std::string className, varName;
    std::tie(className, varName) = splitMemberVarIdent(identifier);
    auto instancePtrPtr = std::make_shared<Reg>("this");
    auto instancePtr = ctx.makeTempLocalReg("instPtr");
    ctx.emplaceInst<Load>(instancePtr, instancePtrPtr);
    return getMemberElementPtr(instancePtr, className, varName);
  }
  return std::make_shared<Reg>(std::move(identifier));
}